

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialization.h
# Opt level: O0

errc psql::deserialize_struct<3ul,psql::single_row_description>
               (single_row_description *output,deserialization_context *ctx)

{
  errc err;
  __tuple_element_t<3UL,_tuple<string_null_single_row_description::*,_int_single_row_description::*,_short_single_row_description::*,_int_single_row_description::*,_short_single_row_description::*,_int_single_row_description::*,_short_single_row_description::*>_>
  pmem;
  tuple<psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  fields;
  deserialization_context *ctx_local;
  single_row_description *output_local;
  
  fields.
  super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .super__Head_base<0UL,_psql::string_null_psql::single_row_description::*,_false>._M_head_impl =
       (type)ctx;
  memset(&pmem,0,0x38);
  pmem = 0x24;
  fields.
  super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<1UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<2UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<3UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<4UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<5UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .super__Tuple_impl<6UL,_short_psql::single_row_description::*>.
  super__Head_base<6UL,_short_psql::single_row_description::*,_false>._M_head_impl =
       (_Head_base<6UL,_short_psql::single_row_description::*,_false>)0x20;
  fields.
  super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<1UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<2UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<3UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<4UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<5UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .super__Head_base<5UL,_int_psql::single_row_description::*,_false>._M_head_impl = 0x1c;
  fields.
  super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<1UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<2UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<3UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<4UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .super__Head_base<4UL,_short_psql::single_row_description::*,_false>._M_head_impl = 0x18;
  fields.
  super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<1UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<2UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<3UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .super__Head_base<3UL,_int_psql::single_row_description::*,_false>._M_head_impl = 0x14;
  fields.
  super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<1UL,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .
  super__Tuple_impl<2UL,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
  .super__Head_base<2UL,_short_psql::single_row_description::*,_false>._M_head_impl = 0x10;
  output_local._4_4_ =
       deserialize<int>(&output->type_oid,
                        (deserialization_context *)
                        fields.
                        super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
                        .
                        super__Head_base<0UL,_psql::string_null_psql::single_row_description::*,_false>
                        ._M_head_impl);
  if (output_local._4_4_ == ok) {
    output_local._4_4_ =
         deserialize_struct<4ul,psql::single_row_description>
                   (output,(deserialization_context *)
                           fields.
                           super__Tuple_impl<0UL,_psql::string_null_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*,_int_psql::single_row_description::*,_short_psql::single_row_description::*>
                           .
                           super__Head_base<0UL,_psql::string_null_psql::single_row_description::*,_false>
                           ._M_head_impl);
  }
  return output_local._4_4_;
}

Assistant:

errc deserialize_struct(
	[[maybe_unused]] T& output,
	[[maybe_unused]] deserialization_context& ctx
) noexcept
{
	constexpr auto fields = get_struct_fields<T>::value;
	if constexpr (index == std::tuple_size<decltype(fields)>::value)
	{
		return errc::ok;
	}
	else
	{
		constexpr auto pmem = std::get<index>(fields);
		errc err = deserialize(output.*pmem, ctx);
		if (err != errc::ok)
		{
			return err;
		}
		else
		{
			return deserialize_struct<index+1>(output, ctx);
		}
	}
}